

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O0

void __thiscall cmOptionalLinkInterface::cmOptionalLinkInterface(cmOptionalLinkInterface *this)

{
  cmOptionalLinkInterface *this_local;
  
  cmLinkInterface::cmLinkInterface(&this->super_cmLinkInterface);
  (this->super_cmLinkInterface).field_0x69 = 0;
  (this->super_cmLinkInterface).field_0x6a = 0;
  (this->super_cmLinkInterface).field_0x6b = 0;
  (this->super_cmLinkInterface).field_0x6c = 0;
  this->ExplicitLibraries = (char *)0x0;
  return;
}

Assistant:

cmOptionalLinkInterface()
    : LibrariesDone(false)
    , AllDone(false)
    , Exists(false)
    , HadHeadSensitiveCondition(false)
    , ExplicitLibraries(CM_NULLPTR)
  {
  }